

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O2

void hpke_nonce(EVP_HPKE_CTX *ctx,uint8_t *out_nonce,size_t nonce_len)

{
  size_t i;
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  
  if (7 < nonce_len) {
    memset(out_nonce,0,nonce_len);
    uVar1 = ctx->seq;
    lVar3 = 8;
    while (lVar3 != 0) {
      out_nonce[lVar3 + (nonce_len - 9)] = (uint8_t)uVar1;
      uVar1 = uVar1 >> 8;
      lVar3 = lVar3 + -1;
    }
    for (sVar2 = 0; nonce_len != sVar2; sVar2 = sVar2 + 1) {
      out_nonce[sVar2] = out_nonce[sVar2] ^ ctx->base_nonce[sVar2];
    }
    return;
  }
  __assert_fail("nonce_len >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,1000,"void hpke_nonce(const EVP_HPKE_CTX *, uint8_t *, size_t)");
}

Assistant:

static void hpke_nonce(const EVP_HPKE_CTX *ctx, uint8_t *out_nonce,
                       size_t nonce_len) {
  assert(nonce_len >= 8);

  // Write padded big-endian bytes of |ctx->seq| to |out_nonce|.
  OPENSSL_memset(out_nonce, 0, nonce_len);
  uint64_t seq_copy = ctx->seq;
  for (size_t i = 0; i < 8; i++) {
    out_nonce[nonce_len - i - 1] = seq_copy & 0xff;
    seq_copy >>= 8;
  }

  // XOR the encoded sequence with the |ctx->base_nonce|.
  for (size_t i = 0; i < nonce_len; i++) {
    out_nonce[i] ^= ctx->base_nonce[i];
  }
}